

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

int Cudd_RemoveHook(DdManager *dd,DD_HFP f,Cudd_HookType where)

{
  DdHook *__ptr;
  DdHook **ppDVar1;
  int iVar2;
  DdHook **ppDVar3;
  
  iVar2 = 0;
  if (where < 4) {
    ppDVar1 = &dd->preGCHook + where;
    do {
      ppDVar3 = ppDVar1;
      __ptr = *ppDVar3;
      if (__ptr == (DdHook *)0x0) {
        return 0;
      }
      ppDVar1 = &__ptr->next;
    } while (__ptr->f != f);
    *ppDVar3 = __ptr->next;
    free(__ptr);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
Cudd_RemoveHook(
  DdManager * dd,
  DD_HFP f,
  Cudd_HookType where)
{
    DdHook **hook, *nextHook;

    switch (where) {
    case CUDD_PRE_GC_HOOK:
        hook = &(dd->preGCHook);
        break;
    case CUDD_POST_GC_HOOK:
        hook = &(dd->postGCHook);
        break;
    case CUDD_PRE_REORDERING_HOOK:
        hook = &(dd->preReorderingHook);
        break;
    case CUDD_POST_REORDERING_HOOK:
        hook = &(dd->postReorderingHook);
        break;
    default:
        return(0);
    }
    nextHook = *hook;
    while (nextHook != NULL) {
        if (nextHook->f == f) {
            *hook = nextHook->next;
            ABC_FREE(nextHook);
            return(1);
        }
        hook = &(nextHook->next);
        nextHook = nextHook->next;
    }

    return(0);

}